

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helix.cc
# Opt level: O0

void helix_session_set_send_callback(helix_session_t session,helix_send_callback_t callback)

{
  session *psVar1;
  helix_session_t in_RDI;
  anon_class_16_2_bb9fc7e6 *__f;
  function<void_(char_*,_unsigned_long)> *in_stack_ffffffffffffffb0;
  anon_class_16_2_bb9fc7e6 local_30 [3];
  
  psVar1 = unwrap(in_RDI);
  __f = local_30;
  std::function<void(char*,unsigned_long)>::function<helix_session_set_send_callback::__0,void>
            (in_stack_ffffffffffffffb0,__f);
  (*psVar1->_vptr_session[5])(psVar1,__f);
  std::function<void_(char_*,_unsigned_long)>::~function
            ((function<void_(char_*,_unsigned_long)> *)0x1357c4);
  return;
}

Assistant:

void helix_session_set_send_callback(helix_session_t session, helix_send_callback_t callback)
{
    unwrap(session)->set_send_callback([session, callback](char* base, size_t len) {
        callback(session, base, len);
    });
}